

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O3

Ptr<Semaphore> __thiscall myvk::Semaphore::Create(Semaphore *this,Ptr<Device> *device)

{
  VkResult VVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Ptr<Semaphore> PVar3;
  VkSemaphoreCreateInfo info;
  _func_int **local_48;
  element_type *peStack_40;
  VkSemaphoreCreateInfo local_38;
  
  std::__shared_ptr<myvk::Semaphore,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::Semaphore>>
            ((__shared_ptr<myvk::Semaphore,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (allocator<myvk::Semaphore> *)&local_38);
  local_48[3] = (_func_int *)
                (device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 4),
             &(device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_38.pNext = (void *)0x0;
  local_38.flags = 0;
  local_38._20_4_ = 0;
  local_38.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
  local_38._4_4_ = 0;
  VVar1 = (*vkCreateSemaphore)
                    (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                     ->m_device,&local_38,(VkAllocationCallbacks *)0x0,(VkSemaphore *)(local_48 + 5)
                    );
  _Var2._M_pi = extraout_RDX;
  if (VVar1 == VK_SUCCESS) {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_48;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_40;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    if (peStack_40 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_40);
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  PVar3.super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Semaphore>)PVar3.super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Semaphore> Semaphore::Create(const Ptr<Device> &device) {
	auto ret = std::make_shared<Semaphore>();
	ret->m_device_ptr = device;

	VkSemaphoreCreateInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
	if (vkCreateSemaphore(device->GetHandle(), &info, nullptr, &ret->m_semaphore) != VK_SUCCESS)
		return nullptr;
	return ret;
}